

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O3

void __thiscall higan::FileForAppend::FileForAppend(FileForAppend *this,string *url)

{
  pointer pcVar1;
  FILE *__stream;
  
  (this->url_)._M_dataplus._M_p = (pointer)&(this->url_).field_2;
  pcVar1 = (url->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + url->_M_string_length);
  __stream = fopen((url->_M_dataplus)._M_p,"ae");
  this->file_fp_ = (FILE *)__stream;
  this->write_sum_bytes_ = 0;
  if (__stream != (FILE *)0x0) {
    setbuffer(__stream,this->buffer,0x8000);
    return;
  }
  __assert_fail("file_fp_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/base/File.cpp"
                ,0x60,"higan::FileForAppend::FileForAppend(const std::string &)");
}

Assistant:

FileForAppend::FileForAppend(const std::string& url) :
		url_(url),
		file_fp_(fopen(url.c_str(), "ae")), // a O_WRONLY | O_CREAT | O_APPEND e O_CLOEXEC
		write_sum_bytes_(0)
{
	assert(file_fp_);
	setbuffer(file_fp_, buffer, sizeof buffer);
}